

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::createSelectionSets
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this)

{
  vector<int,_std::allocator<int>_> local_28;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_28,&this->nObjects);
  SelectionSet::SelectionSet(__return_storage_ptr__,&local_28);
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::createSelectionSets() {
    SelectionSet ss(nObjects);
    return ss;
  }